

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  RTCIntersectFunctionN p_Var13;
  ulong uVar14;
  undefined4 uVar15;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  int mask_1;
  ulong local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  NodeRef *local_8c0;
  RayQueryContext *local_8b8;
  Scene *local_8b0;
  ulong local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar35 = ray->tfar, 0.0 <= fVar35)) {
    local_8c0 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar53 = (ray->org).field_0.m128[0];
    fVar57 = (ray->org).field_0.m128[1];
    fVar39 = (ray->org).field_0.m128[2];
    aVar5 = (ray->dir).field_0.field_1;
    fVar36 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar43 = 0.0;
    if (0.0 <= fVar36) {
      fVar43 = fVar36;
    }
    auVar25._4_4_ = -(uint)(ABS(aVar5.y) < DAT_01ff1d40._4_4_);
    auVar25._0_4_ = -(uint)(ABS(aVar5.x) < (float)DAT_01ff1d40);
    auVar25._8_4_ = -(uint)(ABS(aVar5.z) < DAT_01ff1d40._8_4_);
    auVar25._12_4_ = -(uint)(ABS(aVar5.field_3.w) < DAT_01ff1d40._12_4_);
    auVar26 = blendvps((undefined1  [16])aVar5,_DAT_01ff1d40,auVar25);
    auVar25 = rcpps(auVar25,auVar26);
    fVar47 = auVar25._0_4_;
    fVar48 = auVar25._4_4_;
    fVar50 = auVar25._8_4_;
    fVar47 = (1.0 - auVar26._0_4_ * fVar47) * fVar47 + fVar47;
    fVar48 = (1.0 - auVar26._4_4_ * fVar48) * fVar48 + fVar48;
    fVar50 = (1.0 - auVar26._8_4_ * fVar50) * fVar50 + fVar50;
    uVar16 = (ulong)(fVar47 < 0.0) << 4;
    uVar17 = (ulong)(fVar48 < 0.0) << 4 | 0x20;
    uVar18 = (ulong)(fVar50 < 0.0) << 4 | 0x40;
    uVar19 = uVar16 ^ 0x10;
    uVar23 = uVar17 ^ 0x10;
    uVar21 = uVar18 ^ 0x10;
    fVar36 = fVar35;
    fVar37 = fVar35;
    fVar38 = fVar35;
    fVar40 = fVar39;
    fVar41 = fVar39;
    fVar42 = fVar39;
    fVar44 = fVar43;
    fVar45 = fVar43;
    fVar46 = fVar43;
    fVar49 = fVar50;
    fVar51 = fVar50;
    fVar52 = fVar50;
    fVar54 = fVar53;
    fVar55 = fVar53;
    fVar56 = fVar53;
    fVar58 = fVar57;
    fVar59 = fVar57;
    fVar60 = fVar57;
    fVar61 = fVar47;
    fVar62 = fVar47;
    fVar63 = fVar47;
    fVar64 = fVar48;
    fVar65 = fVar48;
    fVar66 = fVar48;
    local_8e8 = uVar23;
    local_8e0 = uVar19;
    local_8d8 = uVar18;
    local_8d0 = uVar17;
    local_8c8 = uVar16;
    local_8b8 = context;
    local_858 = fVar48;
    fStack_854 = fVar48;
    fStack_850 = fVar48;
    fStack_84c = fVar48;
    local_848 = fVar47;
    fStack_844 = fVar47;
    fStack_840 = fVar47;
    fStack_83c = fVar47;
    local_838 = fVar57;
    fStack_834 = fVar57;
    fStack_830 = fVar57;
    fStack_82c = fVar57;
    local_828 = fVar53;
    fStack_824 = fVar53;
    fStack_820 = fVar53;
    fStack_81c = fVar53;
    local_818 = fVar50;
    fStack_814 = fVar50;
    fStack_810 = fVar50;
    fStack_80c = fVar50;
    local_808 = fVar43;
    fStack_804 = fVar43;
    fStack_800 = fVar43;
    fStack_7fc = fVar43;
    local_7f8 = fVar39;
    fStack_7f4 = fVar39;
    fStack_7f0 = fVar39;
    fStack_7ec = fVar39;
    local_7e8 = fVar35;
    fStack_7e4 = fVar35;
    fStack_7e0 = fVar35;
    fStack_7dc = fVar35;
    do {
      if (local_8c0 == stack) {
        return;
      }
      sVar20 = local_8c0[-1].ptr;
      local_8c0 = local_8c0 + -1;
      do {
        if ((sVar20 & 8) == 0) {
          fVar9 = (ray->dir).field_0.m128[3];
          uVar10 = sVar20 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar10 + 0x80 + uVar16);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
          auVar28._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar53) * fVar47;
          auVar28._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar54) * fVar61;
          auVar28._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar55) * fVar62;
          auVar28._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar56) * fVar63;
          auVar31._4_4_ = fVar44;
          auVar31._0_4_ = fVar43;
          auVar31._8_4_ = fVar45;
          auVar31._12_4_ = fVar46;
          pfVar2 = (float *)(uVar10 + 0x80 + uVar17);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar17);
          auVar25 = maxps(auVar31,auVar28);
          auVar32._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar57) * fVar48;
          auVar32._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar58) * fVar64;
          auVar32._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar59) * fVar65;
          auVar32._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar60) * fVar66;
          pfVar2 = (float *)(uVar10 + 0x80 + uVar18);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar18);
          auVar29._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar39) * fVar50;
          auVar29._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar40) * fVar49;
          auVar29._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar41) * fVar51;
          auVar29._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar42) * fVar52;
          auVar26 = maxps(auVar32,auVar29);
          auVar25 = maxps(auVar25,auVar26);
          pfVar2 = (float *)(uVar10 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar19);
          auVar33._0_4_ = ((*pfVar2 * fVar9 + *pfVar1) - fVar53) * fVar47;
          auVar33._4_4_ = ((pfVar2[1] * fVar9 + pfVar1[1]) - fVar54) * fVar61;
          auVar33._8_4_ = ((pfVar2[2] * fVar9 + pfVar1[2]) - fVar55) * fVar62;
          auVar33._12_4_ = ((pfVar2[3] * fVar9 + pfVar1[3]) - fVar56) * fVar63;
          auVar30._4_4_ = fVar36;
          auVar30._0_4_ = fVar35;
          auVar30._8_4_ = fVar37;
          auVar30._12_4_ = fVar38;
          auVar31 = minps(auVar30,auVar33);
          pfVar3 = (float *)(uVar10 + 0x80 + uVar23);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar23);
          pfVar4 = (float *)(uVar10 + 0x80 + uVar21);
          pfVar2 = (float *)(uVar10 + 0x20 + uVar21);
          auVar34._0_4_ = ((*pfVar3 * fVar9 + *pfVar1) - fVar57) * fVar48;
          auVar34._4_4_ = ((pfVar3[1] * fVar9 + pfVar1[1]) - fVar58) * fVar64;
          auVar34._8_4_ = ((pfVar3[2] * fVar9 + pfVar1[2]) - fVar59) * fVar65;
          auVar34._12_4_ = ((pfVar3[3] * fVar9 + pfVar1[3]) - fVar60) * fVar66;
          auVar26._4_4_ = ((pfVar4[1] * fVar9 + pfVar2[1]) - fVar40) * fVar49;
          auVar26._0_4_ = ((*pfVar4 * fVar9 + *pfVar2) - fVar39) * fVar50;
          auVar26._8_4_ = ((pfVar4[2] * fVar9 + pfVar2[2]) - fVar41) * fVar51;
          auVar26._12_4_ = ((pfVar4[3] * fVar9 + pfVar2[3]) - fVar42) * fVar52;
          auVar26 = minps(auVar34,auVar26);
          auVar26 = minps(auVar31,auVar26);
          bVar24 = auVar25._0_4_ <= auVar26._0_4_;
          bVar6 = auVar25._4_4_ <= auVar26._4_4_;
          bVar7 = auVar25._8_4_ <= auVar26._8_4_;
          bVar8 = auVar25._12_4_ <= auVar26._12_4_;
          if (((uint)sVar20 & 7) == 6) {
            bVar24 = (fVar9 < *(float *)(uVar10 + 0xf0) && *(float *)(uVar10 + 0xe0) <= fVar9) &&
                     bVar24;
            bVar6 = (fVar9 < *(float *)(uVar10 + 0xf4) && *(float *)(uVar10 + 0xe4) <= fVar9) &&
                    bVar6;
            bVar7 = (fVar9 < *(float *)(uVar10 + 0xf8) && *(float *)(uVar10 + 0xe8) <= fVar9) &&
                    bVar7;
            bVar8 = (fVar9 < *(float *)(uVar10 + 0xfc) && *(float *)(uVar10 + 0xec) <= fVar9) &&
                    bVar8;
          }
          auVar27._0_4_ = (uint)bVar24 * -0x80000000;
          auVar27._4_4_ = (uint)bVar6 * -0x80000000;
          auVar27._8_4_ = (uint)bVar7 * -0x80000000;
          auVar27._12_4_ = (uint)bVar8 * -0x80000000;
          uVar15 = movmskps((int)unaff_RBX,auVar27);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar15);
        }
        if ((sVar20 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar22 = 4;
          }
          else {
            uVar10 = sVar20 & 0xfffffffffffffff0;
            lVar12 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            iVar22 = 0;
            sVar20 = *(size_t *)(uVar10 + lVar12 * 8);
            uVar14 = unaff_RBX - 1 & unaff_RBX;
            if (uVar14 != 0) {
              local_8c0->ptr = sVar20;
              lVar12 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar11 = uVar14 - 1;
              while( true ) {
                local_8c0 = local_8c0 + 1;
                sVar20 = *(size_t *)(uVar10 + lVar12 * 8);
                uVar11 = uVar11 & uVar14;
                if (uVar11 == 0) break;
                local_8c0->ptr = sVar20;
                lVar12 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar14 = uVar11 - 1;
              }
            }
          }
        }
        else {
          iVar22 = 6;
        }
      } while (iVar22 == 0);
      if (iVar22 == 6) {
        iVar22 = 0;
        local_8a8 = (ulong)((uint)sVar20 & 0xf) - 8;
        bVar24 = local_8a8 != 0;
        if (bVar24) {
          local_8b0 = local_8b8->scene;
          uVar10 = 0;
          do {
            local_8a0.geomID = *(uint *)((sVar20 & 0xfffffffffffffff0) + uVar10 * 8);
            local_870 = (local_8b0->geometries).items[local_8a0.geomID].ptr;
            if ((ray->mask & local_870->mask) != 0) {
              local_8a0.primID = *(uint *)((sVar20 & 0xfffffffffffffff0) + 4 + uVar10 * 8);
              mask_1 = -1;
              local_8a0.valid = &mask_1;
              local_8a0.geometryUserPtr = local_870->userPtr;
              local_8a0.context = local_8b8->user;
              local_8a0.N = 1;
              local_868 = 0;
              local_860 = local_8b8->args;
              p_Var13 = local_860->intersect;
              if (p_Var13 == (RTCIntersectFunctionN)0x0) {
                p_Var13 = (RTCIntersectFunctionN)
                          local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i;
              }
              local_8a0.rayhit = (RTCRayHitN *)ray;
              (*p_Var13)(&local_8a0);
              fVar35 = local_7e8;
              fVar36 = fStack_7e4;
              fVar37 = fStack_7e0;
              fVar38 = fStack_7dc;
              fVar39 = local_7f8;
              fVar40 = fStack_7f4;
              fVar41 = fStack_7f0;
              fVar42 = fStack_7ec;
              fVar43 = local_808;
              fVar44 = fStack_804;
              fVar45 = fStack_800;
              fVar46 = fStack_7fc;
              fVar50 = local_818;
              fVar49 = fStack_814;
              fVar51 = fStack_810;
              fVar52 = fStack_80c;
              fVar53 = local_828;
              fVar54 = fStack_824;
              fVar55 = fStack_820;
              fVar56 = fStack_81c;
              fVar57 = local_838;
              fVar58 = fStack_834;
              fVar59 = fStack_830;
              fVar60 = fStack_82c;
              fVar47 = local_848;
              fVar61 = fStack_844;
              fVar62 = fStack_840;
              fVar63 = fStack_83c;
              fVar48 = local_858;
              fVar64 = fStack_854;
              fVar65 = fStack_850;
              fVar66 = fStack_84c;
              if (ray->tfar <= 0.0 && ray->tfar != 0.0) {
                uVar16 = local_8c8;
                uVar17 = local_8d0;
                uVar18 = local_8d8;
                uVar19 = local_8e0;
                uVar23 = local_8e8;
                if (bVar24) {
                  ray->tfar = -INFINITY;
                  iVar22 = 3;
                }
                break;
              }
            }
            uVar10 = uVar10 + 1;
            bVar24 = uVar10 < local_8a8;
            uVar16 = local_8c8;
            uVar17 = local_8d0;
            uVar18 = local_8d8;
            uVar19 = local_8e0;
            uVar23 = local_8e8;
          } while (uVar10 != local_8a8);
        }
      }
    } while (iVar22 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }